

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlSwitchToEncoding(xmlParserCtxtPtr ctxt,xmlCharEncodingHandlerPtr handler)

{
  int code;
  int iVar1;
  
  iVar1 = -1;
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    code = xmlInputSetEncodingHandler(ctxt->input,handler);
    if (code == 0) {
      iVar1 = 0;
    }
    else {
      xmlCtxtErrIO(ctxt,code,(char *)0x0);
    }
  }
  return iVar1;
}

Assistant:

int
xmlSwitchToEncoding(xmlParserCtxtPtr ctxt, xmlCharEncodingHandlerPtr handler)
{
    int code;

    if (ctxt == NULL)
        return(-1);

    code = xmlInputSetEncodingHandler(ctxt->input, handler);
    if (code != XML_ERR_OK) {
        xmlCtxtErrIO(ctxt, code, NULL);
        return(-1);
    }

    return(0);
}